

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::HostAddress::ParseAddress(HostAddress *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  string *address;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  string tmp;
  uint8_t maybeIp6 [16];
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  char local_c0;
  string local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined1 local_3e;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  pcVar1 = (this->m_ipString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (this->m_ipString)._M_string_length);
  lVar4 = std::__cxx11::string::find((char)&local_88,0x3a);
  if (lVar4 != -1) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    lVar4 = std::__cxx11::string::rfind((char)&local_b8,0x25);
    if (lVar4 != -1) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_b8);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
    }
    Split(&local_68,&local_b8,':');
    uVar8 = (uint)((int)local_68.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (int)local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xff;
    if (uVar8 - 9 < 0xfffffffa) {
LAB_001b80cb:
      bVar2 = false;
    }
    else {
      local_40 = 0x3a3a;
      local_48 = 2;
      local_3e = 0;
      bVar9 = 0;
      local_50 = &local_40;
      lVar4 = std::__cxx11::string::find((char *)&local_b8,(ulong)&local_40,0);
      if (lVar4 != -1) {
        bVar9 = 0;
        do {
          bVar9 = bVar9 + 1;
          lVar4 = std::__cxx11::string::find((char *)&local_b8,(ulong)local_50,lVar4 + 1);
        } while (lVar4 != -1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if ((uVar8 == 8 && 1 < bVar9) ||
         ((lVar4 = std::__cxx11::string::find((char)&local_b8,0x2e), bVar9 != 1 &&
          (uVar8 < (lVar4 == -1) + 7)))) goto LAB_001b80cb;
      bVar2 = uVar8 == 0;
      iVar3 = uVar8 - 1;
      if (!bVar2) {
        uVar7 = (ulong)(9 - uVar8);
        local_c0 = (char)iVar3;
        uVar11 = (ulong)local_c0;
        lVar4 = 0x10;
        do {
          lVar5 = CONCAT44(local_68.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)local_68.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          uVar6 = CONCAT44(local_68.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           (int)local_68.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish) - lVar5 >> 5;
          if (uVar6 <= uVar11) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar11);
          }
          iVar10 = (int)uVar11;
          if (*(long *)(lVar5 + 8 + uVar11 * 0x20) == 0) {
            if (iVar3 == iVar10) {
              if (uVar6 <= iVar10 - 1) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              lVar5 = *(long *)(lVar5 + 8 + (ulong)(iVar10 - 1) * 0x20);
            }
            else {
              if (uVar11 != 0) {
                if (uVar7 != 0) {
                  uVar6 = 1;
                  do {
                    if (lVar4 == 0) goto LAB_001b82d4;
                    *(undefined2 *)((long)&local_b8.field_2 + lVar4 + 0xe) = 0;
                    lVar4 = lVar4 + -2;
                    bVar2 = uVar6 < uVar7;
                    uVar6 = (ulong)(byte)((char)uVar6 + 1);
                  } while (bVar2);
                }
                goto LAB_001b82d0;
              }
              if (uVar6 < 2) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,1);
              }
              lVar5 = *(long *)(lVar5 + 0x28);
            }
            if (lVar5 != 0) {
              *(undefined2 *)((long)&local_b8.field_2 + lVar4 + 0xe) = 0;
              lVar4 = lVar4 + -2;
              goto LAB_001b82d0;
            }
LAB_001b82d4:
            bVar2 = false;
          }
          else {
            address = (string *)(lVar5 + uVar11 * 0x20);
            uVar6 = strtoul((address->_M_dataplus)._M_p,(char **)0x0,0x10);
            if ((short)(uVar6 >> 0x10) == 0) {
              *(ushort *)((long)&local_b8.field_2 + lVar4 + 0xe) =
                   (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
              lVar4 = lVar4 + -2;
              bVar2 = true;
            }
            else if (iVar3 == iVar10) {
              bVar2 = ParseIp4(address,(uint32_t *)&local_50);
              if (bVar2) {
                *(uint *)((long)&local_b8.field_2 + lVar4 + 0xc) =
                     (uint)local_50 >> 0x18 | ((uint)local_50 & 0xff0000) >> 8 |
                     ((uint)local_50 & 0xff00) << 8 | (uint)local_50 << 0x18;
                lVar4 = lVar4 + -4;
                uVar7 = uVar7 - 1;
              }
            }
            else {
              bVar2 = false;
            }
            if (bVar2 == false) goto LAB_001b82d4;
LAB_001b82d0:
            bVar2 = true;
          }
          if (!bVar2) goto LAB_001b80cb;
          bVar2 = (long)uVar11 < 1;
        } while ((0 < (long)uVar11) && (uVar11 = uVar11 - 1, lVar4 != 0));
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (bVar2) {
      *(undefined8 *)(this->m_ip6Address).data = local_98;
      *(undefined8 *)((this->m_ip6Address).data + 8) = uStack_90;
      this->m_protocol = IPv6Protocol;
      this->m_hasIpAddress = true;
      bVar2 = true;
      goto LAB_001b815f;
    }
  }
  lVar4 = std::__cxx11::string::find((char)&local_88,0x2e);
  if (lVar4 != -1) {
    local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffff00000000;
    bVar2 = ParseIp4(&local_88,(uint32_t *)&local_b8);
    if (bVar2) {
      this->m_ip4Address = (uint32_t)local_b8._M_dataplus._M_p;
      this->m_protocol = IPv4Protocol;
      this->m_hasIpAddress = true;
      bVar2 = true;
      goto LAB_001b815f;
    }
  }
  this->m_protocol = UnknownNetworkProtocol;
  bVar2 = false;
LAB_001b815f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool HostAddress::ParseAddress()
{

    // all IPv6 addresses should have a ':'
    std::string s = m_ipString;
    std::size_t found = s.find(':');
    if (found != std::string::npos) {
        // try parse IP6 address
        uint8_t maybeIp6[16];
        if (ParseIp6(s, maybeIp6)) {
            SetAddress(maybeIp6);
            m_protocol = HostAddress::IPv6Protocol;
            return true;
        }
    }

    // all IPv4 addresses should have a '.'
    found = s.find('.');
    if (found != std::string::npos) {
        uint32_t maybeIp4(0);
        if (ParseIp4(s, maybeIp4)) {
            SetAddress(maybeIp4);
            m_protocol = HostAddress::IPv4Protocol;
            return true;
        }
    }

    // else likely just a plain-text host name "www.foo.bar"
    // will need to look up IP address info later
    m_protocol = HostAddress::UnknownNetworkProtocol;
    return false;
}